

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3PoslistPhraseMerge(char **pp,int nToken,int isSaveLeft,int isExact,char **pp1,char **pp2)

{
  undefined1 *puVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  undefined1 *puVar9;
  byte bVar10;
  char *pEnd_2;
  byte *pbVar11;
  undefined1 *puVar12;
  char *pEnd_1;
  undefined1 *puVar13;
  int iVar14;
  undefined1 *puVar15;
  byte *pbVar16;
  byte *pbVar17;
  uchar *q;
  char *pEnd;
  long in_FS_OFFSET;
  int iCol2;
  int iCol1;
  byte *local_88;
  byte *local_78;
  int local_48;
  int local_44;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = (byte *)*pp;
  local_88 = (byte *)*pp1;
  pbVar11 = (byte *)*pp2;
  local_44 = 0;
  local_48 = 0;
  if (*local_88 == 1) {
    if ((char)local_88[1] < '\0') {
      uVar5 = sqlite3Fts3GetVarint32((char *)(local_88 + 1),&local_44);
      uVar6 = (ulong)uVar5;
    }
    else {
      uVar6 = 1;
      local_44 = (int)(char)local_88[1];
    }
    if (local_44 != 0) {
      local_88 = local_88 + 1 + uVar6;
      goto LAB_001cc144;
    }
  }
  else {
LAB_001cc144:
    iVar4 = local_44;
    iVar14 = 0;
    if (*pbVar11 == 1) {
      if ((char)pbVar11[1] < '\0') {
        uVar5 = sqlite3Fts3GetVarint32((char *)(pbVar11 + 1),&local_48);
        uVar6 = (ulong)uVar5;
      }
      else {
        uVar6 = 1;
        local_48 = (int)(char)pbVar11[1];
      }
      if (local_48 == 0) goto LAB_001cc551;
      pbVar11 = pbVar11 + 1 + uVar6;
      iVar14 = local_48;
    }
    while( true ) {
      while (pbVar16 = local_78, iVar4 != iVar14) {
        if (iVar4 < iVar14) {
          bVar8 = *local_88;
          if (1 < bVar8) {
            do {
              bVar10 = bVar8 & 0x80;
              bVar8 = local_88[1];
              local_88 = local_88 + 1;
            } while ((bVar8 & 0xfe) != 0 || bVar10 != 0);
          }
          if (bVar8 == 0) goto LAB_001cc4e7;
          if ((char)local_88[1] < '\0') {
            uVar5 = sqlite3Fts3GetVarint32((char *)(local_88 + 1),&local_44);
            uVar6 = (ulong)uVar5;
          }
          else {
            uVar6 = 1;
            local_44 = (int)(char)local_88[1];
          }
          local_88 = local_88 + 1 + uVar6;
          iVar14 = local_48;
          iVar4 = local_44;
        }
        else {
          bVar8 = *pbVar11;
          if (1 < bVar8) {
            do {
              bVar10 = bVar8 & 0x80;
              bVar8 = pbVar11[1];
              pbVar11 = pbVar11 + 1;
            } while ((bVar8 & 0xfe) != 0 || bVar10 != 0);
          }
          if (bVar8 == 0) goto LAB_001cc4e7;
          if ((char)pbVar11[1] < '\0') {
            uVar5 = sqlite3Fts3GetVarint32((char *)(pbVar11 + 1),&local_48);
            uVar6 = (ulong)uVar5;
          }
          else {
            uVar6 = 1;
            local_48 = (int)(char)pbVar11[1];
          }
          pbVar11 = pbVar11 + 1 + uVar6;
          iVar14 = local_48;
          iVar4 = local_44;
        }
      }
      if (iVar14 != 0) {
        *local_78 = 1;
        uVar6 = (long)local_44;
        pbVar16 = local_78 + 1;
        do {
          pbVar17 = pbVar16;
          bVar8 = (byte)uVar6;
          *pbVar17 = bVar8 | 0x80;
          pbVar16 = pbVar17 + 1;
          bVar2 = 0x7f < uVar6;
          uVar6 = uVar6 >> 7;
        } while (bVar2);
        *pbVar17 = bVar8;
      }
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar4 = sqlite3Fts3GetVarintU((char *)local_88,(sqlite_uint64 *)&local_40);
      puVar15 = local_40;
      local_88 = local_88 + iVar4;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar4 = sqlite3Fts3GetVarintU((char *)pbVar11,(sqlite_uint64 *)&local_40);
      pbVar11 = pbVar11 + iVar4;
      if (((long)puVar15 < 2) || ((long)local_40 < 2)) break;
      puVar12 = local_40 + -2;
      puVar9 = (undefined1 *)0x0;
      while( true ) {
        puVar15 = puVar15 + -2;
        puVar1 = puVar15 + nToken;
        while( true ) {
          if ((puVar12 == puVar1) ||
             ((((long)puVar12 <= (long)puVar1 && (isExact == 0)) && ((long)puVar15 < (long)puVar12))
             )) {
            puVar13 = puVar15;
            if (isSaveLeft == 0) {
              puVar13 = puVar12;
            }
            puVar9 = puVar13 + (2 - (long)puVar9);
            do {
              pbVar17 = pbVar16;
              bVar8 = (byte)puVar9;
              *pbVar17 = bVar8 | 0x80;
              pbVar16 = pbVar17 + 1;
              bVar2 = (undefined1 *)0x7f < puVar9;
              puVar9 = (undefined1 *)((ulong)puVar9 >> 7);
            } while (bVar2);
            *pbVar17 = bVar8;
            local_78 = (byte *)0x0;
            puVar9 = puVar13;
          }
          if (((long)puVar15 < (long)puVar12) && (isSaveLeft != 0 || (long)puVar1 < (long)puVar12))
          break;
          if (*pbVar11 < 2) {
            bVar8 = *local_88;
            if (local_78 == (byte *)0x0) {
              local_78 = pbVar16;
            }
            if (1 < bVar8) {
              do {
                bVar10 = bVar8 & 0x80;
                bVar8 = local_88[1];
                local_88 = local_88 + 1;
              } while ((bVar8 & 0xfe) != 0 || bVar10 != 0);
            }
            goto LAB_001cc3be;
          }
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          iVar4 = sqlite3Fts3GetVarintU((char *)pbVar11,(sqlite_uint64 *)&local_40);
          pbVar11 = pbVar11 + iVar4;
          puVar12 = puVar12 + (long)local_40 + -2;
        }
        bVar8 = *local_88;
        if (bVar8 < 2) break;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        iVar4 = sqlite3Fts3GetVarintU((char *)local_88,(sqlite_uint64 *)&local_40);
        local_88 = local_88 + iVar4;
        puVar15 = puVar15 + (long)local_40;
      }
      if (local_78 == (byte *)0x0) {
        local_78 = pbVar16;
      }
LAB_001cc3be:
      bVar10 = *pbVar11;
      if (1 < bVar10) {
        do {
          bVar3 = bVar10 & 0x80;
          bVar10 = pbVar11[1];
          pbVar11 = pbVar11 + 1;
        } while ((bVar10 & 0xfe) != 0 || bVar3 != 0);
      }
      pbVar16 = local_78;
      if (bVar8 == 0) break;
      if (bVar10 == 0) {
        pbVar11 = pbVar11 + 1;
        goto LAB_001cc513;
      }
      if ((char)local_88[1] < '\0') {
        uVar5 = sqlite3Fts3GetVarint32((char *)(local_88 + 1),&local_44);
        uVar6 = (ulong)uVar5;
      }
      else {
        uVar6 = 1;
        local_44 = (int)(char)local_88[1];
      }
      if ((char)pbVar11[1] < '\0') {
        uVar5 = sqlite3Fts3GetVarint32((char *)(pbVar11 + 1),&local_48);
        uVar7 = (ulong)uVar5;
      }
      else {
        uVar7 = 1;
        local_48 = (int)(char)pbVar11[1];
      }
      local_88 = local_88 + 1 + uVar6;
      pbVar11 = pbVar11 + 1 + uVar7;
      iVar14 = local_48;
      iVar4 = local_44;
    }
LAB_001cc4e7:
    bVar8 = *pbVar11;
    if (*pbVar11 != 0) {
      do {
        pbVar17 = pbVar11 + 1;
        pbVar11 = pbVar11 + 1;
        bVar10 = bVar8 & 0x80;
        bVar8 = *pbVar17;
      } while (bVar10 != 0 || *pbVar17 != 0);
    }
    bVar8 = *local_88;
    pbVar11 = pbVar11 + 1;
    if (bVar8 != 0) {
LAB_001cc513:
      do {
        pbVar17 = local_88 + 1;
        local_88 = local_88 + 1;
        bVar10 = bVar8 & 0x80;
        bVar8 = *pbVar17;
      } while (bVar10 != 0 || *pbVar17 != 0);
    }
    *pp1 = (char *)(local_88 + 1);
    *pp2 = (char *)pbVar11;
    if ((byte *)*pp != pbVar16) {
      *pbVar16 = 0;
      *pp = (char *)(pbVar16 + 1);
      iVar4 = 1;
      goto LAB_001cc553;
    }
  }
LAB_001cc551:
  iVar4 = 0;
LAB_001cc553:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int fts3PoslistPhraseMerge(
  char **pp,                      /* IN/OUT: Preallocated output buffer */
  int nToken,                     /* Maximum difference in token positions */
  int isSaveLeft,                 /* Save the left position */
  int isExact,                    /* If *pp1 is exactly nTokens before *pp2 */
  char **pp1,                     /* IN/OUT: Left input list */
  char **pp2                      /* IN/OUT: Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;
  int iCol1 = 0;
  int iCol2 = 0;

  /* Never set both isSaveLeft and isExact for the same invocation. */
  assert( isSaveLeft==0 || isExact==0 );

  assert_fts3_nc( p!=0 && *p1!=0 && *p2!=0 );
  if( *p1==POS_COLUMN ){
    p1++;
    p1 += fts3GetVarint32(p1, &iCol1);
    /* iCol1==0 indicates corruption. Column 0 does not have a POS_COLUMN
    ** entry, so this is actually end-of-doclist. */
    if( iCol1==0 ) return 0;
  }
  if( *p2==POS_COLUMN ){
    p2++;
    p2 += fts3GetVarint32(p2, &iCol2);
    /* As above, iCol2==0 indicates corruption. */
    if( iCol2==0 ) return 0;
  }

  while( 1 ){
    if( iCol1==iCol2 ){
      char *pSave = p;
      sqlite3_int64 iPrev = 0;
      sqlite3_int64 iPos1 = 0;
      sqlite3_int64 iPos2 = 0;

      if( iCol1 ){
        *p++ = POS_COLUMN;
        p += sqlite3Fts3PutVarint(p, iCol1);
      }

      fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
      fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
      if( iPos1<0 || iPos2<0 ) break;

      while( 1 ){
        if( iPos2==iPos1+nToken
         || (isExact==0 && iPos2>iPos1 && iPos2<=iPos1+nToken)
        ){
          sqlite3_int64 iSave;
          iSave = isSaveLeft ? iPos1 : iPos2;
          fts3PutDeltaVarint(&p, &iPrev, iSave+2); iPrev -= 2;
          pSave = 0;
          assert( p );
        }
        if( (!isSaveLeft && iPos2<=(iPos1+nToken)) || iPos2<=iPos1 ){
          if( (*p2&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
        }else{
          if( (*p1&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
        }
      }

      if( pSave ){
        assert( pp && p );
        p = pSave;
      }

      fts3ColumnlistCopy(0, &p1);
      fts3ColumnlistCopy(0, &p2);
      assert( (*p1&0xFE)==0 && (*p2&0xFE)==0 );
      if( 0==*p1 || 0==*p2 ) break;

      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }

    /* Advance pointer p1 or p2 (whichever corresponds to the smaller of
    ** iCol1 and iCol2) so that it points to either the 0x00 that marks the
    ** end of the position list, or the 0x01 that precedes the next
    ** column-number in the position list.
    */
    else if( iCol1<iCol2 ){
      fts3ColumnlistCopy(0, &p1);
      if( 0==*p1 ) break;
      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
    }else{
      fts3ColumnlistCopy(0, &p2);
      if( 0==*p2 ) break;
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }
  }

  fts3PoslistCopy(0, &p2);
  fts3PoslistCopy(0, &p1);
  *pp1 = p1;
  *pp2 = p2;
  if( *pp==p ){
    return 0;
  }
  *p++ = 0x00;
  *pp = p;
  return 1;
}